

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::SignaturePruning::
iteration(wasm::Module*)::Info,(wasm::Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::
function<void(wasm::Function*,wasm::(anonymous_namespace)::SignaturePruning::iteration(wasm::
Module*)::Info&)>)::Mapper::doWalkFunction(wasm::Function__(void *this,Function *curr)

{
  _Rb_tree_color *this_00;
  _Base_ptr p_Var1;
  _Rb_tree_color *p_Var2;
  _Base_ptr p_Var3;
  mapped_type_conflict *__args_1;
  Function *local_20;
  Function *curr_local;
  
  this_00 = *(_Rb_tree_color **)((long)this + 0x138);
  p_Var3 = (_Base_ptr)(this_00 + 2);
  p_Var2 = this_00;
  while (p_Var1 = *(_Base_ptr *)(p_Var2 + 4), p_Var1 != (_Base_ptr)0x0) {
    if (*(Function **)(p_Var1 + 1) >= curr) {
      p_Var3 = p_Var1;
    }
    p_Var2 = &p_Var1->_M_color + (ulong)(*(Function **)(p_Var1 + 1) < curr) * 2;
  }
  local_20 = curr;
  if ((p_Var3 != (_Base_ptr)(this_00 + 2)) && (*(Function **)(p_Var3 + 1) <= curr)) {
    __args_1 = std::
               map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
               ::operator[]((map<wasm::Function_*,_Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_Info>_>_>
                             *)this_00,&local_20);
    std::function<void_(wasm::Function_*,_Info_&)>::operator()
              ((function<void_(wasm::Function_*,_Info_&)> *)((long)this + 0x140),curr,__args_1);
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<Info>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = Info, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }